

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Descriptor * __thiscall google::protobuf::MethodDescriptor::input_type(MethodDescriptor *this)

{
  once_flag *control;
  anon_class_16_2_d159f980 *in_RDX;
  ServiceDescriptor *local_20;
  ServiceDescriptor **local_18;
  LazyDescriptor *local_10;
  
  local_20 = this->service_;
  control = (this->input_type_).once_;
  if (control != (once_flag *)0x0) {
    local_18 = &local_20;
    if ((control->control_).super___atomic_base<unsigned_int>._M_i != 0xdd) {
      local_10 = &this->input_type_;
      absl::lts_20250127::base_internal::
      CallOnceImpl<google::protobuf::internal::LazyDescriptor::Once(google::protobuf::ServiceDescriptor_const*)::__0>
                (&control->control_,(SchedulingMode)&local_18,in_RDX);
    }
  }
  return (this->input_type_).descriptor_;
}

Assistant:

const Descriptor* MethodDescriptor::input_type() const {
  return input_type_.Get(service());
}